

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

int Diligent::Parsing::GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *End,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *NameEnd)

{
  bool bVar1;
  reference pcVar2;
  int local_64;
  int local_4c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  int Index;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *NameEnd_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Start_local;
  
  Pos = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(Start,End);
  NameEnd->_M_current = (char *)Pos;
  bVar1 = __gnu_cxx::operator==(NameEnd,Start);
  if (bVar1) {
    Start_local._4_4_ = -0x80000000;
  }
  else {
    bVar1 = __gnu_cxx::operator==(NameEnd,End);
    if (bVar1) {
      Start_local._4_4_ = -1;
    }
    else {
      local_38 = SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                           (NameEnd,End," \t");
      bVar1 = __gnu_cxx::operator==(&local_38,End);
      if ((bVar1) ||
         (pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_38), *pcVar2 != '[')) {
        Start_local._4_4_ = -0x80000000;
      }
      else {
        _Stack_48 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_38,1);
        local_40 = (char *)SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     (&stack0xffffffffffffffb8,End," \t");
        local_38 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_40;
        bVar1 = __gnu_cxx::operator==(&local_38,End);
        if (bVar1) {
          Start_local._4_4_ = -0x80000000;
        }
        else {
          local_4c = -0x80000000;
          local_38 = ParseInteger<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
                               (&local_38,End,&local_4c);
          local_38 = SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                               (&local_38,End," \t");
          bVar1 = __gnu_cxx::operator!=(&local_38,End);
          if ((bVar1) &&
             (pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_38), *pcVar2 == ']')) {
            local_64 = local_4c;
          }
          else {
            local_64 = -0x80000000;
          }
          Start_local._4_4_ = local_64;
        }
      }
    }
  }
  return Start_local._4_4_;
}

Assistant:

inline int GetArrayIndex(const InteratorType& Start, const InteratorType& End, InteratorType& NameEnd)
{
    NameEnd = SkipIdentifier(Start, End);
    // Empty name is not a valid identifier
    if (NameEnd == Start)
    {
        //
        //  ^
        return InvalidArrayIndex;
    }

    if (NameEnd == End)
    {
        // MyArray
        //        ^
        return -1;
    }
    // MyArray [ 16 ]
    //        ^

    auto Pos = SkipDelimiters(NameEnd, End, " \t");
    // MyArray [ 16 ]
    //         ^
    if (Pos == End || *Pos != '[')
        return InvalidArrayIndex;

    Pos = SkipDelimiters(Pos + 1, End, " \t");
    // MyArray [ 16 ]
    //           ^
    if (Pos == End)
        return InvalidArrayIndex;

    int Index = InvalidArrayIndex;
    Pos       = ParseInteger(Pos, End, Index);
    // MyArray [ 16 ]
    //             ^

    Pos = SkipDelimiters(Pos, End, " \t");
    // MyArray [ 16 ]
    //              ^
    return (Pos != End && *Pos == ']') ? Index : InvalidArrayIndex;
}